

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O2

void __thiscall llbuild::basic::ProcessGroup::signalAll(ProcessGroup *this,int signal)

{
  __node_base *p_Var1;
  
  std::mutex::lock(&this->mutex);
  p_Var1 = &(this->processes)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if ((signal != 2) || (*(undefined1 *)((long)(p_Var1 + 1) + 4) == '\x01')) {
      kill(-(int)*(size_type *)(p_Var1 + 1),signal);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void ProcessGroup::signalAll(int signal) {
  std::lock_guard<std::mutex> lock(mutex);

  for (const auto& it: processes) {
    // If we are interrupting, only interupt processes which are believed to
    // be safe to interrupt.
    if (signal == SIGINT && !it.second.canSafelyInterrupt)
      continue;

    // We are killing the whole process group here, this depends on us
    // spawning each process in its own group earlier.
#if defined(_WIN32)
    TerminateProcess(it.first, signal);
#else
    ::kill(-it.first, signal);
#endif
  }
}